

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_do_edit(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_flags flags,
                   nk_plugin_filter filter,nk_text_edit *edit,nk_style_edit *style,nk_input *in,
                   nk_user_font *font)

{
  ulong uVar1;
  byte bVar2;
  nk_color nVar3;
  nk_color background;
  nk_color nVar4;
  nk_plugin_copy p_Var5;
  nk_plugin_paste p_Var6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  nk_color *pnVar17;
  byte bVar18;
  uint uVar19;
  nk_color *pnVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  nk_color *pnVar24;
  nk_color nVar25;
  char *pcVar26;
  void *pvVar27;
  nk_style_edit *pnVar28;
  uchar uVar29;
  nk_color *pnVar30;
  nk_color *pnVar31;
  long lVar32;
  nk_style_edit *pnVar33;
  nk_style_edit *pnVar34;
  nk_size nVar35;
  int iVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  nk_vec2 nVar40;
  undefined1 auVar41 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar43;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar50;
  float fVar47;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect scroll;
  nk_rect r_01;
  nk_rect rect_01;
  nk_rect b;
  nk_rect r_02;
  nk_rune unicode_1;
  int glyph_offset;
  nk_rune unicode;
  int glyph_len;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int local_204;
  float local_1dc;
  char *local_1a0;
  nk_rune local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  nk_style_edit *local_170;
  char *local_168;
  nk_style_edit *local_160;
  nk_flags local_158;
  int local_154;
  int local_150;
  int local_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  uint *local_130;
  nk_size local_128;
  char *local_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  nk_command_buffer *local_100;
  char *local_f8;
  float local_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  nk_style_edit *local_c8;
  nk_style_edit *local_c0;
  nk_text local_b8;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_e8 = bounds._8_8_;
  local_d8 = bounds._0_8_;
  local_130 = state;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5966,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5967,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_edit *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5968,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  fVar52 = style->border;
  fVar45 = (style->padding).x;
  fVar50 = (style->padding).y;
  fVar44 = fVar52 + fVar52;
  local_e8._0_4_ = bounds.w;
  local_e8._4_4_ = bounds.h;
  fStack_e0 = bounds.w;
  fStack_dc = bounds.h;
  local_118 = (float)local_e8 - (fVar45 + fVar45 + fVar44);
  fStack_114 = local_e8._4_4_ - (fVar50 + fVar50 + fVar44);
  fStack_110 = fStack_e0 - (fVar44 + 0.0);
  fStack_10c = fStack_dc - (fVar44 + 0.0);
  fVar44 = fStack_114;
  fVar47 = fStack_114;
  if ((flags >> 10 & 1) != 0) {
    local_118 = local_118 - (style->scrollbar_size).x;
    if (local_118 <= 0.0) {
      local_118 = 0.0;
    }
    fVar44 = font->height + style->row_padding;
    fVar47 = 0.0;
  }
  uVar1._0_4_ = (out->clip).x;
  uVar1._4_4_ = (out->clip).y;
  local_48._0_4_ = (out->clip).w;
  local_48._4_4_ = (out->clip).h;
  uStack_40 = 0;
  bVar2 = edit->active;
  local_d8._0_4_ = bounds.x;
  local_d8._4_4_ = bounds.y;
  bVar18 = bVar2;
  if (in == (nk_input *)0x0) {
    uVar19 = 0;
  }
  else {
    fVar51 = (in->mouse).pos.x;
    bVar37 = fVar51 < (float)local_d8 + (float)local_e8;
    uVar19 = 0;
    if (((float)local_d8 <= fVar51 && bVar37) &&
       (fVar38 = (in->mouse).pos.y, local_d8._4_4_ <= fVar38)) {
      uVar19 = (uint)(fVar38 < local_d8._4_4_ + local_e8._4_4_);
    }
    if (((in->mouse).buttons[0].clicked != 0) && ((in->mouse).buttons[0].down != 0)) {
      if ((float)local_d8 <= fVar51 && bVar37) {
        fVar51 = (in->mouse).pos.y;
        bVar18 = local_d8._4_4_ <= fVar51 && fVar51 < local_d8._4_4_ + local_e8._4_4_;
      }
      else {
        bVar18 = false;
      }
      edit->active = bVar18;
    }
  }
  fStack_d0 = bounds.x;
  fStack_cc = bounds.y;
  if (bVar2 == 0) {
    if (bVar18 == 0) goto LAB_00123ed1;
    (edit->undo).undo_point = 0;
    (edit->undo).redo_point = 99;
    (edit->undo).undo_char_point = 0;
    (edit->undo).redo_char_point = 999;
    edit->cursor = 0;
    edit->select_start = 0;
    edit->select_end = 0;
    edit->mode = '\0';
    edit->cursor_at_end_of_line = '\0';
    edit->initialized = '\x01';
    edit->has_preferred_x = '\0';
    edit->preferred_x = 0.0;
    edit->single_line = (flags >> 10 & 1) == 0;
    edit->filter = filter;
    (edit->scrollbar).x = 0.0;
    (edit->scrollbar).y = 0.0;
    bVar37 = (flags & 2) == 0;
    if ((flags >> 0xb & 1) != 0) {
      edit->cursor = (edit->string).len;
      in = (nk_input *)0x0;
    }
  }
  else {
    bVar37 = true;
    if (bVar18 == 0) {
LAB_00123ed1:
      edit->mode = '\0';
      bVar37 = true;
    }
  }
  fVar45 = fVar45 + (float)local_d8 + fVar52;
  fVar50 = fVar50 + local_d8._4_4_ + fVar52;
  fVar51 = fStack_d0 + 0.0 + fVar52;
  fVar52 = fStack_cc + 0.0 + fVar52;
  if ((flags & 1) == 0) {
    uVar29 = '\x01';
    if ((flags >> 9 & 1) != 0) goto LAB_00123f03;
  }
  else {
    uVar29 = '\0';
LAB_00123f03:
    edit->mode = uVar29;
  }
  local_148 = fVar45 + local_118;
  fStack_144 = fVar50 + fStack_114;
  fStack_140 = fVar51 + fStack_110;
  fStack_13c = fVar52 + fStack_10c;
  local_158 = (uint)(bVar18 == 0) * 5 + 5;
  if ((int)(char)bVar2 == (uint)bVar18) {
    local_158 = (bVar18 == 0) + 1;
  }
  bVar12 = true;
  if ((in != (nk_input *)0x0) && (bVar18 != 0)) {
    iVar14 = (in->keyboard).keys[1].down;
    fVar38 = (in->mouse).pos.x;
    fVar46 = (in->mouse).pos.y;
    uVar19 = (uint)(byte)((fVar46 < fStack_144 && fVar50 <= fVar46) &
                         -(fVar38 < local_148 && fVar45 <= fVar38));
    local_188 = CONCAT44(local_188._4_4_,uVar19);
    if (bVar37) {
      if (uVar19 == 0) goto LAB_0012405d;
      if ((in->mouse).buttons[0].down == 0) {
LAB_00125134:
        if (((in->mouse).buttons[2].clicked == 0) || ((in->mouse).buttons[2].down == 0))
        goto LAB_0012405d;
        nk_textedit_key(edit,NK_KEY_TEXT_WORD_LEFT,0,font,fVar44);
        nk_textedit_key(edit,NK_KEY_TEXT_WORD_RIGHT,1,font,fVar44);
        bVar12 = true;
      }
      else {
        fVar38 = (fVar38 - fVar45) + (edit->scrollbar).x;
        fVar46 = (fVar46 - fVar50) + (edit->scrollbar).y;
        if ((in->mouse).buttons[0].clicked != 0) {
          iVar13 = nk_textedit_locate_coord(edit,fVar38,fVar46,font,fVar44);
          edit->cursor = iVar13;
          edit->select_start = iVar13;
          edit->select_end = iVar13;
          edit->has_preferred_x = '\0';
          goto LAB_0012405d;
        }
        fVar43 = (in->mouse).delta.x;
        if ((((fVar43 == 0.0) && (!NAN(fVar43))) && (fVar43 = (in->mouse).delta.y, fVar43 == 0.0))
           && (!NAN(fVar43))) goto LAB_00125134;
        iVar13 = nk_textedit_locate_coord(edit,fVar38,fVar46,font,fVar44);
        if (edit->select_start == edit->select_end) {
          edit->select_start = edit->cursor;
        }
        edit->select_end = iVar13;
        edit->cursor = iVar13;
        bVar12 = true;
      }
    }
    else {
      edit->select_start = 0;
      edit->select_end = (edit->string).len;
LAB_0012405d:
      bVar12 = false;
    }
    uVar29 = edit->mode;
    lVar32 = 0;
    do {
      if (((nk_keys)lVar32 & NK_KEY_MAX) != NK_KEY_ENTER) {
        uVar19 = (in->keyboard).keys[lVar32].clicked;
        if ((in->keyboard).keys[lVar32].down == 0) {
          if (1 < uVar19) goto LAB_00124088;
        }
        else if (uVar19 != 0) {
LAB_00124088:
          nk_textedit_key(edit,(nk_keys)lVar32,iVar14,font,fVar44);
          bVar12 = true;
        }
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0x1e);
    if (uVar29 == edit->mode) {
      iVar13 = (in->keyboard).text_len;
      edit->filter = filter;
      if (iVar13 != 0) {
        nk_textedit_text(edit,(in->keyboard).text,iVar13);
        (in->keyboard).text_len = 0;
        bVar12 = true;
      }
    }
    else {
      (in->keyboard).text_len = 0;
      edit->filter = filter;
    }
    uVar19 = (in->keyboard).keys[4].clicked;
    if ((in->keyboard).keys[4].down == 0) {
      if (1 < uVar19) goto LAB_0012413c;
    }
    else if (uVar19 != 0) {
LAB_0012413c:
      if ((iVar14 == 0 || -1 < (char)flags) && ((flags & 4) != 0)) {
        local_158 = local_158 + 0x10;
      }
      else {
        nk_textedit_text(edit,"\n",1);
      }
      bVar12 = true;
    }
    uVar19 = (in->keyboard).keys[7].clicked;
    if ((in->keyboard).keys[7].down == 0) {
      if (1 < uVar19) goto LAB_0012418f;
LAB_00124198:
      bVar2 = 1;
    }
    else {
      if (uVar19 == 0) goto LAB_00124198;
LAB_0012418f:
      bVar2 = 0;
    }
    uVar19 = (in->keyboard).keys[8].clicked;
    if ((in->keyboard).keys[8].down == 0) {
      if (1 < uVar19) goto LAB_001241a7;
LAB_001241b0:
      bVar37 = true;
    }
    else {
      if (uVar19 == 0) goto LAB_001241b0;
LAB_001241a7:
      bVar37 = false;
    }
    if ((flags & 0x40) != 0 && !(bool)(bVar2 & bVar37)) {
      iVar14 = edit->select_start;
      iVar13 = edit->select_end;
      iVar15 = iVar13;
      if (iVar14 < iVar13) {
        iVar15 = iVar14;
      }
      local_100 = out;
      pcVar16 = nk_str_at_const(&edit->string,iVar15,(nk_rune *)&local_120,(int *)&local_b8);
      p_Var5 = (edit->clip).copy;
      if (p_Var5 != (nk_plugin_copy)0x0) {
        if (iVar13 < iVar14) {
          iVar13 = iVar14;
        }
        (*p_Var5)((edit->clip).userdata,pcVar16,iVar13 - iVar15);
      }
      out = local_100;
      if (((!bVar37 && (flags & 1) == 0) && (bVar12 = true, edit->mode != '\0')) &&
         (edit->select_start != edit->select_end)) {
        nk_textedit_delete_selection(edit);
        edit->has_preferred_x = '\0';
      }
    }
    uVar19 = (in->keyboard).keys[9].clicked;
    if ((in->keyboard).keys[9].down == 0) {
      bVar37 = uVar19 < 2;
    }
    else {
      bVar37 = uVar19 == 0;
    }
    if ((!(bool)(bVar37 | (flags & 0x40) == 0)) &&
       (p_Var6 = (edit->clip).paste, p_Var6 != (nk_plugin_paste)0x0)) {
      (*p_Var6)((edit->clip).userdata,edit);
      bVar12 = true;
    }
    uVar21 = (in->keyboard).keys[5].clicked;
    uVar19 = (uint)local_188._0_4_;
    if ((in->keyboard).keys[5].down == 0) {
      if (1 < uVar21) goto LAB_001242eb;
    }
    else if (uVar21 != 0) {
LAB_001242eb:
      if ((flags & 8) != 0) {
        nk_textedit_text(edit,"    ",4);
        bVar12 = true;
      }
    }
    bVar12 = !bVar12;
    bVar18 = edit->active;
  }
  auVar41._0_4_ = (float)(undefined4)uVar1 + (float)local_48;
  auVar41._4_4_ = (float)uVar1._4_4_ + local_48._4_4_;
  auVar41._8_4_ = (float)uStack_40 + 0.0;
  auVar41._12_4_ = uStack_40._4_4_ + 0.0;
  uVar21 = 0x22;
  if (bVar18 == 0) {
    uVar21 = *local_130 & 2 | 4;
  }
  auVar8._4_4_ = fVar50;
  auVar8._0_4_ = fVar45;
  auVar8._8_4_ = fVar51;
  auVar8._12_4_ = fVar52;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar1;
  local_58 = maxps(auVar8,auVar48);
  uVar7 = uVar21 | 0x12;
  if (uVar19 == 0) {
    uVar7 = uVar21;
  }
  auVar10._4_4_ = fStack_144;
  auVar10._0_4_ = local_148;
  auVar10._8_4_ = fStack_140;
  auVar10._12_4_ = fStack_13c;
  auVar41 = minps(auVar41,auVar10);
  *local_130 = uVar7;
  if ((edit->string).len == 0) {
    local_168 = (char *)0x0;
    local_128 = 0;
  }
  else {
    local_128 = (edit->string).buffer.allocated;
    if (local_128 == 0) {
      local_168 = (char *)0x0;
    }
    else {
      local_168 = (char *)(edit->string).buffer.memory.ptr;
    }
  }
  local_68._4_4_ = auVar41._4_4_ - local_58._4_4_;
  local_68._0_4_ = auVar41._0_4_ - local_58._0_4_;
  fStack_60 = auVar41._8_4_ - local_58._8_4_;
  fStack_5c = auVar41._12_4_ - local_58._12_4_;
  local_c0 = (nk_style_edit *)&style->active;
  local_c8 = (nk_style_edit *)&style->hover;
  uVar23 = (ulong)((uVar7 & 0x10) * 2);
  pnVar33 = local_c8;
  if ((uVar7 & 0x10) == 0) {
    pnVar33 = style;
  }
  if ((uVar7 & 0x20) != 0) {
    pnVar33 = local_c0;
    uVar23 = 0x40;
  }
  if (*(int *)((long)&(style->normal).type + uVar23) == 0) {
    rect.w = (float)local_e8;
    rect.h = local_e8._4_4_;
    rect.x = (float)local_d8;
    rect.y = local_d8._4_4_;
    nk_stroke_rect(out,rect,style->rounding,style->border,style->border_color);
    rect_00.w = (float)local_e8;
    rect_00.h = local_e8._4_4_;
    rect_00.x = (float)local_d8;
    rect_00.y = local_d8._4_4_;
    nk_fill_rect(out,rect_00,style->rounding,(pnVar33->normal).data.color);
  }
  else {
    r.w = (float)local_e8;
    r.h = local_e8._4_4_;
    r.x = (float)local_d8;
    r.y = local_d8._4_4_;
    nk_draw_image(out,r,&(pnVar33->normal).data.image,(nk_color)0xffffffff);
  }
  auVar41 = local_58;
  pcVar16 = local_168;
  auVar48 = maxps(_local_68,_DAT_0014b240);
  iVar14 = (int)font;
  if (edit->active == '\0') {
    nVar25.r = '\0';
    nVar25.g = '\0';
    nVar25.b = '\0';
    nVar25.a = '\0';
    if (((edit->string).len == 0) || (nVar35 = (edit->string).buffer.allocated, nVar35 == 0)) {
      nVar35 = 0;
      pnVar33 = (nk_style_edit *)0x0;
    }
    else {
      pnVar33 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
    }
    r_00._8_8_ = auVar48._0_8_;
    r_00.x = (float)local_58._0_4_;
    r_00.y = (float)local_58._4_4_;
    local_58 = auVar41;
    nk_push_scissor(out,r_00);
    uVar19 = *local_130 & 0x10;
    uVar21 = uVar19 >> 4;
    pnVar28 = local_c8;
    if (uVar19 == 0) {
      pnVar28 = style;
    }
    bVar37 = (*local_130 & 0x20) == 0;
    lVar32 = 0x2e8;
    if (bVar37) {
      lVar32 = (ulong)uVar21 * 4 + 0x2e0;
    }
    pnVar34 = local_c0;
    uVar23 = 0x40;
    if (bVar37) {
      pnVar34 = pnVar28;
      uVar23 = (ulong)(uVar21 << 5);
    }
    if (*(int *)((long)&(style->normal).type + uVar23) != 1) {
      nVar25 = (pnVar34->normal).data.color;
    }
    nk_edit_draw_text(out,pnVar33,fVar45 - (edit->scrollbar).x,fVar50 - (edit->scrollbar).y,0.0,
                      (char *)(nVar35 & 0xffffffff),iVar14,fVar44,
                      (nk_user_font *)(ulong)(uint)nVar25,
                      *(nk_color *)((long)&(style->normal).type + lVar32),(nk_color)0x0,
                      in_stack_fffffffffffffdf0);
    goto LAB_00125099;
  }
  iVar13 = edit->select_start;
  local_154 = edit->select_end;
  local_150 = local_154;
  if (iVar13 < local_154) {
    local_150 = iVar13;
  }
  local_ec = local_118 - style->cursor_size;
  if (local_154 < iVar13) {
    local_154 = iVar13;
  }
  iVar13 = (int)local_128;
  _local_68 = auVar48;
  if (iVar13 == 0 || local_168 == (char *)0x0) {
    _local_a8 = ZEXT816(0);
    pnVar28 = (nk_style_edit *)0x0;
    _local_98 = ZEXT816(0);
    local_148 = 0.0;
    fStack_144 = 0.0;
    fStack_140 = 0.0;
    fStack_13c = 0.0;
    pnVar33 = (nk_style_edit *)0x0;
    local_1a0 = (char *)0x0;
    fVar38 = 0.0;
  }
  else {
    local_18c = 0;
    local_1a0._0_4_ = nk_utf_decode(local_168,&local_18c,iVar13);
    local_1dc = (*font->width)(font->userdata,font->height,pcVar16,(int)local_1a0);
    if ((iVar13 < 1) || ((int)local_1a0 == 0)) {
      local_148 = 0.0;
      fStack_144 = 0.0;
      fStack_140 = 0.0;
      fStack_13c = 0.0;
      local_188 = 0;
      uStack_180 = 0;
      pnVar33 = (nk_style_edit *)0x0;
      pnVar28 = (nk_style_edit *)0x0;
      _local_98 = ZEXT816(0);
      _local_a8 = ZEXT816(0);
      fVar38 = fVar44;
    }
    else {
      pcVar26 = (char *)0x0;
      _local_a8 = ZEXT416(0);
      pnVar33 = (nk_style_edit *)0x0;
      iVar13 = 0;
      local_204 = 0;
      pnVar28 = (nk_style_edit *)0x1;
      pnVar34 = (nk_style_edit *)0x0;
      pcVar16 = local_168;
      fVar47 = 0.0;
      fVar38 = 0.0;
      fVar46 = 0.0;
      fVar43 = 0.0;
      local_100 = out;
      _local_98 = _local_a8;
      local_88 = _local_a8;
      do {
        iVar15 = (int)pnVar28;
        local_78 = ZEXT416((uint)((float)(iVar15 + -1) * fVar44));
        local_f8 = pcVar16 + iVar13;
        local_188 = 0;
        uStack_180 = 0;
        iVar22 = iVar13;
        while( true ) {
          if (pcVar26 == (char *)0x0) {
            if (local_204 == edit->cursor) {
              nVar40 = nk_text_calculate_text_bounds
                                 (font,local_f8,iVar22 - iVar13,fVar44,&local_120,&local_b8.padding,
                                  &local_14c,in_stack_fffffffffffffde8);
              fVar47 = nVar40.x;
              fVar46 = (float)extraout_XMM0_Qb;
              fVar43 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
              pcVar26 = pcVar16 + iVar22;
              fVar38 = (float)local_78._0_4_;
            }
            else {
              pcVar26 = (char *)0x0;
            }
          }
          local_148 = fVar47;
          fStack_144 = fVar38;
          fStack_140 = fVar46;
          fStack_13c = fVar43;
          if (pnVar33 == (nk_style_edit *)0x0) {
            if (edit->select_start == edit->select_end) {
              pnVar33 = (nk_style_edit *)0x0;
            }
            else {
              pnVar33 = (nk_style_edit *)0x0;
              if (local_150 == local_204) {
                nVar40 = nk_text_calculate_text_bounds
                                   (font,local_f8,iVar22 - iVar13,fVar44,&local_120,
                                    &local_b8.padding,&local_14c,in_stack_fffffffffffffde8);
                local_98._4_4_ = local_78._0_4_;
                local_98._0_4_ = nVar40.x;
                uStack_90 = (int)extraout_XMM0_Qb_00;
                uStack_8c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                pnVar33 = (nk_style_edit *)(pcVar16 + iVar22);
              }
            }
          }
          if (pnVar34 == (nk_style_edit *)0x0) {
            if (edit->select_start == edit->select_end) {
              pnVar34 = (nk_style_edit *)0x0;
            }
            else {
              pnVar34 = (nk_style_edit *)0x0;
              if (local_154 == local_204) {
                nVar40 = nk_text_calculate_text_bounds
                                   (font,local_f8,iVar22 - iVar13,fVar44,&local_120,
                                    &local_b8.padding,&local_14c,in_stack_fffffffffffffde8);
                local_a8._4_4_ = local_78._0_4_;
                local_a8._0_4_ = nVar40.x;
                uStack_a0 = (int)extraout_XMM0_Qb_01;
                uStack_9c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                pnVar34 = (nk_style_edit *)(pcVar16 + iVar22);
              }
            }
          }
          iVar36 = (int)local_128;
          local_170 = pnVar34;
          if (local_18c == 10) break;
          iVar22 = iVar22 + (int)local_1a0;
          local_160 = pnVar33;
          local_1a0._0_4_ = nk_utf_decode(pcVar16 + iVar22,&local_18c,iVar36 - iVar22);
          fVar39 = (*font->width)(font->userdata,font->height,pcVar16 + iVar22,(int)local_1a0);
          local_188 = CONCAT44(local_188._4_4_,(float)local_188._0_4_ + local_1dc);
          pnVar33 = local_160;
          if ((iVar36 <= iVar22) ||
             (local_204 = local_204 + 1, pnVar34 = local_170, pcVar16 = local_168,
             fVar47 = local_148, fVar38 = fStack_144, fVar46 = fStack_140, fVar43 = fStack_13c,
             local_1dc = fVar39, (int)local_1a0 == 0)) goto LAB_00124a9b;
        }
        local_160 = (nk_style_edit *)(ulong)(iVar15 + 1);
        iVar13 = iVar22 + 1;
        local_1a0._0_4_ = nk_utf_decode(pcVar16 + (long)iVar22 + 1,&local_18c,iVar36 - iVar13);
        local_1dc = (*font->width)(font->userdata,font->height,pcVar16 + (long)iVar22 + 1,
                                   (int)local_1a0);
        if ((float)local_188._0_4_ <= (float)local_88._0_4_) {
          local_188._0_4_ = (nk_color)local_88._0_4_;
        }
        local_88._0_4_ = local_188._0_4_;
        local_188 = 0;
        uStack_180 = 0;
        iVar15 = (int)local_160;
      } while ((iVar13 < iVar36) &&
              (local_204 = local_204 + 1, pnVar28 = local_160, pnVar34 = local_170,
              fVar47 = local_148, fVar38 = fStack_144, fVar46 = fStack_140, fVar43 = fStack_13c,
              (int)local_1a0 != 0));
LAB_00124a9b:
      fVar38 = (float)iVar15 * fVar44;
      fVar47 = 0.0;
      pnVar28 = local_170;
      out = local_100;
      local_1a0 = pcVar26;
      if (pcVar26 != (char *)0x0) goto LAB_00124b10;
    }
    if (edit->cursor == (edit->string).len) {
      fStack_144 = fVar38 - fVar44;
      local_148 = (float)local_188._0_4_;
      fStack_140 = local_188._4_4_;
      fStack_13c = fVar47;
    }
    local_1a0 = (char *)0x0;
  }
LAB_00124b10:
  if (bVar12) {
    if ((flags >> 10 & 1) != 0) {
      fVar47 = (edit->scrollbar).y;
LAB_00124c25:
      fVar46 = (style->scrollbar_size).x;
      auVar11._4_4_ = fStack_114;
      auVar11._0_4_ = local_118;
      auVar11._8_4_ = fStack_110;
      auVar11._12_4_ = fStack_10c;
      auVar49._4_12_ = auVar11._4_12_;
      auVar49._0_4_ = fVar46;
      auVar9._4_4_ = fVar50;
      auVar9._0_4_ = fVar45;
      auVar9._8_4_ = fVar51;
      auVar9._12_4_ = fVar52;
      auVar42._4_12_ = auVar9._4_12_;
      auVar42._0_4_ = (((float)local_d8 + (float)local_e8) - style->border) - fVar46;
      scroll._0_8_ = auVar42._0_8_;
      scroll._8_8_ = auVar49._0_8_;
      fVar52 = nk_do_scrollbarv((nk_flags *)&local_b8,out,scroll,0,fVar47,fVar38,fStack_114 * 0.1,
                                fStack_114 * 0.01,&style->scrollbar,in,font);
      (edit->scrollbar).y = fVar52;
    }
  }
  else {
    if ((flags >> 8 & 1) == 0) {
      fVar47 = local_ec;
      if (local_ec <= 0.0) {
        fVar47 = 0.0;
      }
      fVar46 = (edit->scrollbar).x;
      if (local_148 < fVar46) {
        fVar46 = local_148 - fVar47 * 0.25;
        if (fVar46 <= 0.0) {
          fVar46 = 0.0;
        }
        fVar46 = (float)(int)fVar46;
        (edit->scrollbar).x = fVar46;
      }
      if (fVar47 + fVar46 <= local_148) {
        fVar46 = fVar47 * 0.25 + fVar46;
        (edit->scrollbar).x = (float)(-(uint)(0.0 < fVar46) & (uint)(float)(int)fVar46);
      }
    }
    else {
      (edit->scrollbar).x = 0.0;
    }
    if ((flags >> 10 & 1) != 0) {
      fVar47 = (edit->scrollbar).y;
      if (fStack_144 < fVar47) {
        fVar47 = fStack_144 - fVar44;
        if (fStack_144 - fVar44 <= 0.0) {
          fVar47 = 0.0;
        }
        (edit->scrollbar).y = fVar47;
      }
      if (fStack_114 + fVar47 <= fStack_144) {
        fVar47 = fVar47 + fVar44;
        (edit->scrollbar).y = fVar47;
      }
      goto LAB_00124c25;
    }
    (edit->scrollbar).y = 0.0;
  }
  auVar48 = local_58;
  auVar41 = _local_68;
  r_01.w = (float)local_68._0_4_;
  r_01.h = (float)local_68._4_4_;
  r_01.x = (float)local_58._0_4_;
  r_01.y = (float)local_58._4_4_;
  _local_68 = auVar41;
  local_58 = auVar48;
  nk_push_scissor(out,r_01);
  if ((*local_130 & 0x20) == 0) {
    if ((*local_130 & 0x10) == 0) {
      pnVar24 = &style->text_normal;
      pnVar17 = &style->selected_text_normal;
      pnVar20 = &style->selected_normal;
      pnVar31 = &style->cursor_normal;
      pnVar30 = &style->cursor_text_normal;
      pnVar34 = style;
    }
    else {
      pnVar24 = &style->text_hover;
      pnVar17 = &style->selected_text_hover;
      pnVar20 = &style->selected_hover;
      pnVar30 = &style->cursor_text_hover;
      pnVar31 = &style->cursor_hover;
      pnVar34 = local_c8;
    }
  }
  else {
    pnVar24 = &style->text_active;
    pnVar17 = &style->selected_text_hover;
    pnVar20 = &style->selected_hover;
    pnVar31 = &style->cursor_hover;
    pnVar30 = &style->cursor_text_hover;
    pnVar34 = local_c0;
  }
  uVar19 = 0;
  if ((pnVar34->normal).type != NK_STYLE_ITEM_IMAGE) {
    uVar19 = *(uint *)&(pnVar34->normal).data;
  }
  local_188 = CONCAT44(local_188._4_4_,*pnVar31);
  nVar25 = *pnVar24;
  nVar3 = *pnVar30;
  iVar13 = edit->select_start;
  iVar15 = edit->select_end;
  if (iVar13 == iVar15) {
    if ((edit->string).len == 0) {
      pnVar33 = (nk_style_edit *)0x0;
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = (char *)(edit->string).buffer.allocated;
      if (pcVar16 == (char *)0x0) {
        pnVar33 = (nk_style_edit *)0x0;
      }
      else {
        pnVar33 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
      }
    }
    nk_edit_draw_text(out,pnVar33,fVar45 - (edit->scrollbar).x,fVar50 - (edit->scrollbar).y,0.0,
                      pcVar16,iVar14,fVar44,(nk_user_font *)(ulong)uVar19,nVar25,(nk_color)0x0,
                      in_stack_fffffffffffffdf0);
  }
  else {
    background = *pnVar17;
    nVar4 = *pnVar20;
    local_170 = pnVar28;
    if (0 < local_150) {
      if (((edit->string).len == 0) || ((edit->string).buffer.allocated == 0)) {
        pnVar28 = (nk_style_edit *)0x0;
      }
      else {
        pnVar28 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
      }
      if (pnVar33 == (nk_style_edit *)0x0) {
        __assert_fail("select_begin_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5ae5,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      nk_edit_draw_text(out,pnVar28,fVar45 - (edit->scrollbar).x,fVar50 - (edit->scrollbar).y,0.0,
                        (char *)(ulong)(uint)((int)pnVar33 - (int)pnVar28),iVar14,fVar44,
                        (nk_user_font *)(ulong)uVar19,nVar25,(nk_color)0x0,in_stack_fffffffffffffdf0
                       );
      iVar13 = edit->select_start;
      iVar15 = edit->select_end;
    }
    if (iVar13 != iVar15) {
      if (pnVar33 == (nk_style_edit *)0x0) {
        __assert_fail("select_begin_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5aec,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      pnVar28 = local_170;
      if (local_170 == (nk_style_edit *)0x0) {
        if ((edit->string).len == 0) {
          pvVar27 = (void *)0x0;
          lVar32 = 0;
        }
        else {
          nVar35 = (edit->string).buffer.allocated;
          if (nVar35 == 0) {
            pvVar27 = (void *)0x0;
          }
          else {
            pvVar27 = (edit->string).buffer.memory.ptr;
          }
          lVar32 = (long)(int)nVar35;
        }
        pnVar28 = (nk_style_edit *)((long)pvVar27 + lVar32);
      }
      nk_edit_draw_text(out,pnVar33,fVar45 - (edit->scrollbar).x,
                        (fVar50 + (float)local_98._4_4_) - (edit->scrollbar).y,(float)local_98._0_4_
                        ,(char *)(ulong)(uint)((int)pnVar28 - (int)pnVar33),iVar14,fVar44,
                        (nk_user_font *)(ulong)(uint)nVar4,background,(nk_color)0x1,
                        in_stack_fffffffffffffdf0);
      if ((edit->select_start != edit->select_end) &&
         (iVar13 = (edit->string).len, local_154 < iVar13)) {
        if (iVar13 == 0) {
          iVar13 = 0;
          iVar15 = 0;
        }
        else {
          nVar35 = (edit->string).buffer.allocated;
          if (nVar35 == 0) {
            iVar13 = 0;
          }
          else {
            iVar13 = (int)(edit->string).buffer.memory.ptr;
          }
          iVar15 = (int)nVar35;
        }
        if (pnVar28 == (nk_style_edit *)0x0) {
          __assert_fail("select_end_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x5aff,
                        "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                       );
        }
        nk_edit_draw_text(out,pnVar28,fVar45 - (edit->scrollbar).x,
                          (fVar50 + (float)local_a8._4_4_) - (edit->scrollbar).y,
                          (float)local_a8._0_4_,
                          (char *)(ulong)(uint)((iVar13 + iVar15) - (int)pnVar28),iVar14,fVar44,
                          (nk_user_font *)(ulong)uVar19,nVar25,(nk_color)0x1,
                          in_stack_fffffffffffffdf0);
      }
    }
  }
  if (edit->select_start == edit->select_end) {
    iVar14 = (edit->string).len;
    if (iVar14 == 0) {
      iVar14 = 0;
    }
    else if ((edit->string).buffer.allocated == 0) {
      iVar14 = 0;
    }
    if (edit->cursor < iVar14) {
      if (local_1a0 == (char *)0x0) {
        __assert_fail("cursor_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5b1d,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (*local_1a0 != '\n') {
        iVar14 = nk_utf_decode(local_1a0,(nk_rune *)&local_120,4);
        fVar47 = (fVar45 + local_148) - (edit->scrollbar).x;
        fVar45 = (fVar50 + fStack_144) - (edit->scrollbar).y;
        fVar52 = (*font->width)(font->userdata,font->height,local_1a0,iVar14);
        local_b8.padding.x = 0.0;
        local_b8.padding.y = 0.0;
        local_b8.background = local_188._0_4_;
        local_b8.text = nVar3;
        nk_fill_rect(out,(nk_rect)CONCAT88(CONCAT44(fVar44,fVar52),CONCAT44(fVar45,fVar47)),0.0,
                     local_188._0_4_);
        b.y = fVar45;
        b.x = fVar47;
        b.w = fVar52;
        b.h = fVar44;
        nk_widget_text(out,b,local_1a0,iVar14,&local_b8,0x11,font);
        goto LAB_00125099;
      }
    }
    rect_01.x = (fVar45 + local_148) - (edit->scrollbar).x;
    rect_01.y = ((fVar44 * 0.5 + fVar50 + fStack_144) - font->height * 0.5) - (edit->scrollbar).y;
    rect_01.h = font->height;
    rect_01.w = style->cursor_size;
    nk_fill_rect(out,rect_01,0.0,local_188._0_4_);
  }
LAB_00125099:
  r_02.w = (float)local_48;
  r_02.h = local_48._4_4_;
  r_02.x = (float)(undefined4)uVar1;
  r_02.y = (float)uVar1._4_4_;
  nk_push_scissor(out,r_02);
  return local_158;
}

Assistant:

NK_LIB nk_flags
nk_do_edit(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, nk_flags flags, nk_plugin_filter filter,
    struct nk_text_edit *edit, const struct nk_style_edit *style,
    struct nk_input *in, const struct nk_user_font *font)
{
    struct nk_rect area;
    nk_flags ret = 0;
    float row_height;
    char prev_state = 0;
    char is_hovered = 0;
    char select_all = 0;
    char cursor_follow = 0;
    struct nk_rect old_clip;
    struct nk_rect clip;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(style);
    if (!state || !out || !style)
        return ret;

    /* visible text area calculation */
    area.x = bounds.x + style->padding.x + style->border;
    area.y = bounds.y + style->padding.y + style->border;
    area.w = bounds.w - (2.0f * style->padding.x + 2 * style->border);
    area.h = bounds.h - (2.0f * style->padding.y + 2 * style->border);
    if (flags & NK_EDIT_MULTILINE)
        area.w = NK_MAX(0, area.w - style->scrollbar_size.x);
    row_height = (flags & NK_EDIT_MULTILINE)? font->height + style->row_padding: area.h;

    /* calculate clipping rectangle */
    old_clip = out->clip;
    nk_unify(&clip, &old_clip, area.x, area.y, area.x + area.w, area.y + area.h);

    /* update edit state */
    prev_state = (char)edit->active;
    is_hovered = (char)nk_input_is_mouse_hovering_rect(in, bounds);
    if (in && in->mouse.buttons[NK_BUTTON_LEFT].clicked && in->mouse.buttons[NK_BUTTON_LEFT].down) {
        edit->active = NK_INBOX(in->mouse.pos.x, in->mouse.pos.y,
                                bounds.x, bounds.y, bounds.w, bounds.h);
    }

    /* (de)activate text editor */
    if (!prev_state && edit->active) {
        const enum nk_text_edit_type type = (flags & NK_EDIT_MULTILINE) ?
            NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE;
        nk_textedit_clear_state(edit, type, filter);
        if (flags & NK_EDIT_AUTO_SELECT)
            select_all = nk_true;
        if (flags & NK_EDIT_GOTO_END_ON_ACTIVATE) {
            edit->cursor = edit->string.len;
            in = 0;
        }
    } else if (!edit->active) edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    if (flags & NK_EDIT_READ_ONLY)
        edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    else if (flags & NK_EDIT_ALWAYS_INSERT_MODE)
        edit->mode = NK_TEXT_EDIT_MODE_INSERT;

    ret = (edit->active) ? NK_EDIT_ACTIVE: NK_EDIT_INACTIVE;
    if (prev_state != edit->active)
        ret |= (edit->active) ? NK_EDIT_ACTIVATED: NK_EDIT_DEACTIVATED;

    /* handle user input */
    if (edit->active && in)
    {
        int shift_mod = in->keyboard.keys[NK_KEY_SHIFT].down;
        const float mouse_x = (in->mouse.pos.x - area.x) + edit->scrollbar.x;
        const float mouse_y = (in->mouse.pos.y - area.y) + edit->scrollbar.y;

        /* mouse click handler */
        is_hovered = (char)nk_input_is_mouse_hovering_rect(in, area);
        if (select_all) {
            nk_textedit_select_all(edit);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            in->mouse.buttons[NK_BUTTON_LEFT].clicked) {
            nk_textedit_click(edit, mouse_x, mouse_y, font, row_height);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            (in->mouse.delta.x != 0.0f || in->mouse.delta.y != 0.0f)) {
            nk_textedit_drag(edit, mouse_x, mouse_y, font, row_height);
            cursor_follow = nk_true;
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_RIGHT].clicked &&
            in->mouse.buttons[NK_BUTTON_RIGHT].down) {
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_LEFT, nk_false, font, row_height);
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_RIGHT, nk_true, font, row_height);
            cursor_follow = nk_true;
        }

        {int i; /* keyboard input */
        int old_mode = edit->mode;
        for (i = 0; i < NK_KEY_MAX; ++i) {
            if (i == NK_KEY_ENTER || i == NK_KEY_TAB) continue; /* special case */
            if (nk_input_is_key_pressed(in, (enum nk_keys)i)) {
                nk_textedit_key(edit, (enum nk_keys)i, shift_mod, font, row_height);
                cursor_follow = nk_true;
            }
        }
        if (old_mode != edit->mode) {
            in->keyboard.text_len = 0;
        }}

        /* text input */
        edit->filter = filter;
        if (in->keyboard.text_len) {
            nk_textedit_text(edit, in->keyboard.text, in->keyboard.text_len);
            cursor_follow = nk_true;
            in->keyboard.text_len = 0;
        }

        /* enter key handler */
        if (nk_input_is_key_pressed(in, NK_KEY_ENTER)) {
            cursor_follow = nk_true;
            if (flags & NK_EDIT_CTRL_ENTER_NEWLINE && shift_mod)
                nk_textedit_text(edit, "\n", 1);
            else if (flags & NK_EDIT_SIG_ENTER)
                ret |= NK_EDIT_COMMITED;
            else nk_textedit_text(edit, "\n", 1);
        }

        /* cut & copy handler */
        {int copy= nk_input_is_key_pressed(in, NK_KEY_COPY);
        int cut = nk_input_is_key_pressed(in, NK_KEY_CUT);
        if ((copy || cut) && (flags & NK_EDIT_CLIPBOARD))
        {
            int glyph_len;
            nk_rune unicode;
            const char *text;
            int b = edit->select_start;
            int e = edit->select_end;

            int begin = NK_MIN(b, e);
            int end = NK_MAX(b, e);
            text = nk_str_at_const(&edit->string, begin, &unicode, &glyph_len);
            if (edit->clip.copy)
                edit->clip.copy(edit->clip.userdata, text, end - begin);
            if (cut && !(flags & NK_EDIT_READ_ONLY)){
                nk_textedit_cut(edit);
                cursor_follow = nk_true;
            }
        }}

        /* paste handler */
        {int paste = nk_input_is_key_pressed(in, NK_KEY_PASTE);
        if (paste && (flags & NK_EDIT_CLIPBOARD) && edit->clip.paste) {
            edit->clip.paste(edit->clip.userdata, edit);
            cursor_follow = nk_true;
        }}

        /* tab handler */
        {int tab = nk_input_is_key_pressed(in, NK_KEY_TAB);
        if (tab && (flags & NK_EDIT_ALLOW_TAB)) {
            nk_textedit_text(edit, "    ", 4);
            cursor_follow = nk_true;
        }}
    }

    /* set widget state */
    if (edit->active)
        *state = NK_WIDGET_STATE_ACTIVE;
    else nk_widget_state_reset(state);

    if (is_hovered)
        *state |= NK_WIDGET_STATE_HOVERED;

    /* DRAW EDIT */
    {const char *text = nk_str_get_const(&edit->string);
    int len = nk_str_len_char(&edit->string);

    {/* select background colors/images  */
    const struct nk_style_item *background;
    if (*state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else if (*state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else background = &style->normal;

    /* draw background frame */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_stroke_rect(out, bounds, style->rounding, style->border, style->border_color);
        nk_fill_rect(out, bounds, style->rounding, background->data.color);
    } else nk_draw_image(out, bounds, &background->data.image, nk_white);}

    area.w = NK_MAX(0, area.w - style->cursor_size);
    if (edit->active)
    {
        int total_lines = 1;
        struct nk_vec2 text_size = nk_vec2(0,0);

        /* text pointer positions */
        const char *cursor_ptr = 0;
        const char *select_begin_ptr = 0;
        const char *select_end_ptr = 0;

        /* 2D pixel positions */
        struct nk_vec2 cursor_pos = nk_vec2(0,0);
        struct nk_vec2 selection_offset_start = nk_vec2(0,0);
        struct nk_vec2 selection_offset_end = nk_vec2(0,0);

        int selection_begin = NK_MIN(edit->select_start, edit->select_end);
        int selection_end = NK_MAX(edit->select_start, edit->select_end);

        /* calculate total line count + total space + cursor/selection position */
        float line_width = 0.0f;
        if (text && len)
        {
            /* utf8 encoding */
            float glyph_width;
            int glyph_len = 0;
            nk_rune unicode = 0;
            int text_len = 0;
            int glyphs = 0;
            int row_begin = 0;

            glyph_len = nk_utf_decode(text, &unicode, len);
            glyph_width = font->width(font->userdata, font->height, text, glyph_len);
            line_width = 0;

            /* iterate all lines */
            while ((text_len < len) && glyph_len)
            {
                /* set cursor 2D position and line */
                if (!cursor_ptr && glyphs == edit->cursor)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    cursor_pos.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    cursor_pos.x = row_size.x;
                    cursor_ptr = text + text_len;
                }

                /* set start selection 2D position and line */
                if (!select_begin_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_begin)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_start.y = (float)(NK_MAX(total_lines-1,0)) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_start.x = row_size.x;
                    select_begin_ptr = text + text_len;
                }

                /* set end selection 2D position and line */
                if (!select_end_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_end)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_end.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_end.x = row_size.x;
                    select_end_ptr = text + text_len;
                }
                if (unicode == '\n') {
                    text_size.x = NK_MAX(text_size.x, line_width);
                    total_lines++;
                    line_width = 0;
                    text_len++;
                    glyphs++;
                    row_begin = text_len;
                    glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                    glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
                    continue;
                }

                glyphs++;
                text_len += glyph_len;
                line_width += (float)glyph_width;

                glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                glyph_width = font->width(font->userdata, font->height,
                    text+text_len, glyph_len);
                continue;
            }
            text_size.y = (float)total_lines * row_height;

            /* handle case when cursor is at end of text buffer */
            if (!cursor_ptr && edit->cursor == edit->string.len) {
                cursor_pos.x = line_width;
                cursor_pos.y = text_size.y - row_height;
            }
        }
        {
            /* scrollbar */
            if (cursor_follow)
            {
                /* update scrollbar to follow cursor */
                if (!(flags & NK_EDIT_NO_HORIZONTAL_SCROLL)) {
                    /* horizontal scroll */
                    const float scroll_increment = area.w * 0.25f;
                    if (cursor_pos.x < edit->scrollbar.x)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, cursor_pos.x - scroll_increment);
                    if (cursor_pos.x >= edit->scrollbar.x + area.w)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, edit->scrollbar.x + scroll_increment);
                } else edit->scrollbar.x = 0;

                if (flags & NK_EDIT_MULTILINE) {
                    /* vertical scroll */
                    if (cursor_pos.y < edit->scrollbar.y)
                        edit->scrollbar.y = NK_MAX(0.0f, cursor_pos.y - row_height);
                    if (cursor_pos.y >= edit->scrollbar.y + area.h)
                        edit->scrollbar.y = edit->scrollbar.y + row_height;
                } else edit->scrollbar.y = 0;
            }

            /* scrollbar widget */
            if (flags & NK_EDIT_MULTILINE)
            {
                nk_flags ws;
                struct nk_rect scroll;
                float scroll_target;
                float scroll_offset;
                float scroll_step;
                float scroll_inc;

                scroll = area;
                scroll.x = (bounds.x + bounds.w - style->border) - style->scrollbar_size.x;
                scroll.w = style->scrollbar_size.x;

                scroll_offset = edit->scrollbar.y;
                scroll_step = scroll.h * 0.10f;
                scroll_inc = scroll.h * 0.01f;
                scroll_target = text_size.y;
                edit->scrollbar.y = nk_do_scrollbarv(&ws, out, scroll, 0,
                        scroll_offset, scroll_target, scroll_step, scroll_inc,
                        &style->scrollbar, in, font);
            }
        }

        /* draw text */
        {struct nk_color background_color;
        struct nk_color text_color;
        struct nk_color sel_background_color;
        struct nk_color sel_text_color;
        struct nk_color cursor_color;
        struct nk_color cursor_text_color;
        const struct nk_style_item *background;
        nk_push_scissor(out, clip);

        /* select correct colors to draw */
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_color = style->cursor_hover;
            cursor_text_color = style->cursor_text_hover;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_text_color = style->cursor_text_hover;
            cursor_color = style->cursor_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
            sel_text_color = style->selected_text_normal;
            sel_background_color = style->selected_normal;
            cursor_color = style->cursor_normal;
            cursor_text_color = style->cursor_text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;


        if (edit->select_start == edit->select_end) {
            /* no selection so just draw the complete text */
            const char *begin = nk_str_get_const(&edit->string);
            int l = nk_str_len_char(&edit->string);
            nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
                background_color, text_color, nk_false);
        } else {
            /* edit has selection so draw 1-3 text chunks */
            if (edit->select_start != edit->select_end && selection_begin > 0){
                /* draw unselected text before selection */
                const char *begin = nk_str_get_const(&edit->string);
                NK_ASSERT(select_begin_ptr);
                nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                    area.y - edit->scrollbar.y, 0, begin, (int)(select_begin_ptr - begin),
                    row_height, font, background_color, text_color, nk_false);
            }
            if (edit->select_start != edit->select_end) {
                /* draw selected text */
                NK_ASSERT(select_begin_ptr);
                if (!select_end_ptr) {
                    const char *begin = nk_str_get_const(&edit->string);
                    select_end_ptr = begin + nk_str_len_char(&edit->string);
                }
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_start.y - edit->scrollbar.y,
                    selection_offset_start.x,
                    select_begin_ptr, (int)(select_end_ptr - select_begin_ptr),
                    row_height, font, sel_background_color, sel_text_color, nk_true);
            }
            if ((edit->select_start != edit->select_end &&
                selection_end < edit->string.len))
            {
                /* draw unselected text after selected text */
                const char *begin = select_end_ptr;
                const char *end = nk_str_get_const(&edit->string) +
                                    nk_str_len_char(&edit->string);
                NK_ASSERT(select_end_ptr);
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_end.y - edit->scrollbar.y,
                    selection_offset_end.x,
                    begin, (int)(end - begin), row_height, font,
                    background_color, text_color, nk_true);
            }
        }

        /* cursor */
        if (edit->select_start == edit->select_end)
        {
            if (edit->cursor >= nk_str_len(&edit->string) ||
                (cursor_ptr && *cursor_ptr == '\n')) {
                /* draw cursor at end of line */
                struct nk_rect cursor;
                cursor.w = style->cursor_size;
                cursor.h = font->height;
                cursor.x = area.x + cursor_pos.x - edit->scrollbar.x;
                cursor.y = area.y + cursor_pos.y + row_height/2.0f - cursor.h/2.0f;
                cursor.y -= edit->scrollbar.y;
                nk_fill_rect(out, cursor, 0, cursor_color);
            } else {
                /* draw cursor inside text */
                int glyph_len;
                struct nk_rect label;
                struct nk_text txt;

                nk_rune unicode;
                NK_ASSERT(cursor_ptr);
                glyph_len = nk_utf_decode(cursor_ptr, &unicode, 4);

                label.x = area.x + cursor_pos.x - edit->scrollbar.x;
                label.y = area.y + cursor_pos.y - edit->scrollbar.y;
                label.w = font->width(font->userdata, font->height, cursor_ptr, glyph_len);
                label.h = row_height;

                txt.padding = nk_vec2(0,0);
                txt.background = cursor_color;;
                txt.text = cursor_text_color;
                nk_fill_rect(out, label, 0, cursor_color);
                nk_widget_text(out, label, cursor_ptr, glyph_len, &txt, NK_TEXT_LEFT, font);
            }
        }}
    } else {
        /* not active so just draw text */
        int l = nk_str_len_char(&edit->string);
        const char *begin = nk_str_get_const(&edit->string);

        const struct nk_style_item *background;
        struct nk_color background_color;
        struct nk_color text_color;
        nk_push_scissor(out, clip);
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;
        nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
            area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
            background_color, text_color, nk_false);
    }
    nk_push_scissor(out, old_clip);}
    return ret;
}